

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
util::dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
          (dynamic_array<char,_std::allocator<unsigned_int>,_unsigned_int,_int> *this)

{
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00216170;
  if ((ulong)this->elem_count != 0) {
    operator_delete(this->elems,(ulong)this->elem_count);
    return;
  }
  return;
}

Assistant:

virtual ~dynamic_array()
    {
      if(!empty())
      {
        using local_allocator_traits_type = std::allocator_traits<allocator_type>;

        allocator_type my_alloc;

        auto p = begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto)

        while(p != end())
        {
          local_allocator_traits_type::destroy(my_alloc, p);

          ++p;
        }

        // Destroy the elements and deallocate the range.
        local_allocator_traits_type::deallocate(my_alloc, elems, elem_count);
      }
    }